

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Store::Collect(Store *this)

{
  Index __n;
  bool bVar1;
  Index IVar2;
  Ref *pRVar3;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *this_00;
  pointer pOVar4;
  vector<bool,_std::allocator<bool>_> *this_01;
  iterator iVar5;
  _Bit_iterator __first;
  _Bit_iterator __last;
  byte local_112;
  bool local_111;
  reference local_f0;
  Index local_e0;
  size_t i_2;
  reference local_c8;
  reference local_b8;
  size_type local_a8;
  size_t i_1;
  undefined1 local_98 [5];
  bool new_marked;
  vector<bool,_std::allocator<bool>_> all_marked;
  ulong local_68;
  Index i;
  _Bit_type *local_58;
  uint local_50;
  _Bit_type *local_48;
  uint local_40;
  _Bit_type *local_38;
  uint local_30;
  _Bit_type *local_28;
  uint local_20;
  Index local_18;
  size_t object_count;
  Store *this_local;
  
  object_count = (size_t)this;
  local_18 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::size(&this->objects_);
  this_01 = &this->marks_;
  std::vector<bool,_std::allocator<bool>_>::resize(this_01,local_18,false);
  iVar5 = std::vector<bool,_std::allocator<bool>_>::begin(this_01);
  local_38 = iVar5.super__Bit_iterator_base._M_p;
  local_30 = iVar5.super__Bit_iterator_base._M_offset;
  local_28 = local_38;
  local_20 = local_30;
  iVar5 = std::vector<bool,_std::allocator<bool>_>::end(this_01);
  local_58 = iVar5.super__Bit_iterator_base._M_p;
  local_50 = iVar5.super__Bit_iterator_base._M_offset;
  i._7_1_ = 0;
  __first.super__Bit_iterator_base._M_offset = local_20;
  __first.super__Bit_iterator_base._M_p = local_28;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar5.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar5.super__Bit_iterator_base._0_12_,8);
  local_48 = local_58;
  local_40 = local_50;
  std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)((long)&i + 7));
  for (local_68 = 0; IVar2 = FreeList<wabt::interp::Ref>::size(&this->roots_), __n = local_18,
      local_68 < IVar2; local_68 = local_68 + 1) {
    bVar1 = FreeList<wabt::interp::Ref>::IsUsed(&this->roots_,local_68);
    if (bVar1) {
      pRVar3 = FreeList<wabt::interp::Ref>::Get(&this->roots_,local_68);
      all_marked.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)pRVar3->index;
      Mark(this,(Ref)all_marked.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage);
    }
  }
  i_1._7_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&i_1 + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_98,__n,(bool *)((long)&i_1 + 7),
             (allocator_type *)((long)&i_1 + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&i_1 + 6));
  do {
    i_1._5_1_ = 0;
    for (local_a8 = 0; local_a8 < local_18; local_a8 = local_a8 + 1) {
      local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_98,local_a8);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
      local_111 = false;
      if (!bVar1) {
        local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->marks_,local_a8);
        local_111 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
      }
      if (local_111 != false) {
        _i_2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_98,local_a8);
        std::_Bit_reference::operator=((_Bit_reference *)&i_2,true);
        this_00 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
                  ::Get(&this->objects_,local_a8);
        pOVar4 = std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>::
                 operator->(this_00);
        (*pOVar4->_vptr_Object[2])(pOVar4,this);
        i_1._5_1_ = 1;
      }
    }
  } while ((i_1._5_1_ & 1) != 0);
  for (local_e0 = 0; local_e0 < local_18; local_e0 = local_e0 + 1) {
    bVar1 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
            ::IsUsed(&this->objects_,local_e0);
    local_112 = 0;
    if (bVar1) {
      local_f0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_98,local_e0);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_f0);
      local_112 = bVar1 ^ 0xff;
    }
    if ((local_112 & 1) != 0) {
      FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>::
      Delete(&this->objects_,local_e0);
    }
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_98)
  ;
  return;
}

Assistant:

void Store::Collect() {
  size_t object_count = objects_.size();
  marks_.resize(object_count);
  std::fill(marks_.begin(), marks_.end(), false);

  // First mark all roots.
  for (RootList::Index i = 0; i < roots_.size(); ++i) {
    if (roots_.IsUsed(i)) {
      Mark(roots_.Get(i));
    }
  }

  // TODO: better GC algo.
  // Loop through all newly marked objects and mark their referents.
  std::vector<bool> all_marked(object_count, false);
  bool new_marked;
  do {
    new_marked = false;
    for (size_t i = 0; i < object_count; ++i) {
      if (!all_marked[i] && marks_[i]) {
        all_marked[i] = true;
        objects_.Get(i)->Mark(*this);
        new_marked = true;
      }
    }
  } while (new_marked);

  // Delete all unmarked objects.
  for (size_t i = 0; i < object_count; ++i) {
    if (objects_.IsUsed(i) && !all_marked[i]) {
      objects_.Delete(i);
    }
  }
}